

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O3

void __thiscall kj::anon_unknown_0::TestCase339::run(TestCase339 *this)

{
  uchar *puVar1;
  undefined8 uVar2;
  bool bVar3;
  long lVar4;
  size_t in_RCX;
  char *pcVar5;
  undefined8 uVar6;
  size_t sVar7;
  size_t sVar8;
  kj *pkVar9;
  char *ptrCopy;
  kj *this_00;
  DecodeUriOptions in_R8W;
  char *pcVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  ArrayPtr<const_unsigned_char> bytes_00;
  ArrayPtr<const_unsigned_char> bytes_01;
  ArrayPtr<const_unsigned_char> bytes_02;
  ArrayPtr<const_unsigned_char> bytes_03;
  ArrayPtr<const_unsigned_char> bytes_04;
  ArrayPtr<const_char> text;
  ArrayPtr<const_char> text_00;
  ArrayPtr<const_char> text_01;
  ArrayPtr<const_char> text_02;
  ArrayPtr<const_char> text_03;
  ArrayPtr<const_char> text_04;
  ArrayPtr<const_char> text_05;
  ArrayPtr<const_unsigned_char> bytes_05;
  ArrayPtr<const_char> text_06;
  byte bytes [3];
  EncodingResult<kj::Array<unsigned_char>_> local_148;
  undefined2 local_11c;
  undefined1 local_11a;
  undefined1 local_118 [16];
  ArrayDisposer *local_108;
  EncodingResult<kj::String> local_f8;
  EncodingResult<kj::String> local_d8;
  EncodingResult<kj::String> local_b8;
  EncodingResult<kj::String> local_98;
  EncodingResult<kj::String> local_78;
  EncodingResult<kj::String> local_58;
  EncodingResult<kj::String> local_38;
  bool errors;
  bool errors_00;
  bool errors_01;
  
  bytes_00.size_ = in_RCX;
  bytes_00.ptr = (uchar *)0x3;
  encodeWwwForm((String *)&local_148,(kj *)0x38b288,bytes_00);
  puVar1 = local_148.super_Array<unsigned_char>.ptr;
  pcVar5 = (char *)local_148.super_Array<unsigned_char>.size_;
  bVar11 = true;
  if ((char *)local_148.super_Array<unsigned_char>.size_ == (char *)0x4) {
    bVar11 = (char)*(short *)((long)local_148.super_Array<unsigned_char>.ptr + 2) != 'o' ||
             *(short *)local_148.super_Array<unsigned_char>.ptr != 0x6f66;
  }
  if ((short *)local_148.super_Array<unsigned_char>.ptr != (short *)0x0) {
    local_148.super_Array<unsigned_char>.ptr = (uchar *)0x0;
    local_148.super_Array<unsigned_char>.size_ = 0;
    pcVar10 = pcVar5;
    (**(local_148.super_Array<unsigned_char>.disposer)->_vptr_ArrayDisposer)
              (local_148.super_Array<unsigned_char>.disposer,puVar1,1,pcVar5,pcVar5,0);
    in_R8W = SUB82(pcVar10,0);
  }
  if ((bool)(bVar11 & _::Debug::minSeverity < 3)) {
    pcVar5 = "\"failed: expected \" \"encodeWwwForm(\\\"foo\\\") == \\\"foo\\\"\"";
    in_R8W.nulTerminate = true;
    in_R8W.plusToSpace = true;
    _::Debug::log<char_const(&)[47]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/encoding-test.c++"
               ,0x154,ERROR,"\"failed: expected \" \"encodeWwwForm(\\\"foo\\\") == \\\"foo\\\"\"",
               (char (*) [47])"failed: expected encodeWwwForm(\"foo\") == \"foo\"");
  }
  bytes_01.size_ = (size_t)pcVar5;
  bytes_01.ptr = (uchar *)0x7;
  encodeWwwForm((String *)&local_148,(kj *)0x388b39,bytes_01);
  puVar1 = local_148.super_Array<unsigned_char>.ptr;
  pcVar5 = (char *)local_148.super_Array<unsigned_char>.size_;
  bVar11 = true;
  if ((char *)local_148.super_Array<unsigned_char>.size_ == (char *)0x8) {
    bVar11 = *(int *)((long)local_148.super_Array<unsigned_char>.ptr + 3) != 0x7261622b ||
             *(int *)local_148.super_Array<unsigned_char>.ptr != 0x2b6f6f66;
  }
  if ((int *)local_148.super_Array<unsigned_char>.ptr != (int *)0x0) {
    local_148.super_Array<unsigned_char>.ptr = (uchar *)0x0;
    local_148.super_Array<unsigned_char>.size_ = 0;
    pcVar10 = pcVar5;
    (**(local_148.super_Array<unsigned_char>.disposer)->_vptr_ArrayDisposer)
              (local_148.super_Array<unsigned_char>.disposer,puVar1,1,pcVar5,pcVar5,0);
    in_R8W = SUB82(pcVar10,0);
  }
  if ((bool)(bVar11 & _::Debug::minSeverity < 3)) {
    pcVar5 = "\"failed: expected \" \"encodeWwwForm(\\\"foo bar\\\") == \\\"foo+bar\\\"\"";
    in_R8W.nulTerminate = true;
    in_R8W.plusToSpace = true;
    _::Debug::log<char_const(&)[55]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/encoding-test.c++"
               ,0x155,ERROR,
               "\"failed: expected \" \"encodeWwwForm(\\\"foo bar\\\") == \\\"foo+bar\\\"\"",
               (char (*) [55])"failed: expected encodeWwwForm(\"foo bar\") == \"foo+bar\"");
  }
  bytes_02.size_ = (size_t)pcVar5;
  bytes_02.ptr = (uchar *)0x2;
  encodeWwwForm((String *)&local_148,(kj *)anon_var_dwarf_189feb,bytes_02);
  puVar1 = local_148.super_Array<unsigned_char>.ptr;
  pcVar5 = (char *)local_148.super_Array<unsigned_char>.size_;
  bVar11 = true;
  if ((char *)local_148.super_Array<unsigned_char>.size_ == (char *)0x7) {
    bVar11 = (short)*(int *)((long)local_148.super_Array<unsigned_char>.ptr + 4) != 0x4142 ||
             *(int *)local_148.super_Array<unsigned_char>.ptr != 0x25424125;
  }
  if ((int *)local_148.super_Array<unsigned_char>.ptr != (int *)0x0) {
    local_148.super_Array<unsigned_char>.ptr = (uchar *)0x0;
    local_148.super_Array<unsigned_char>.size_ = 0;
    pcVar10 = pcVar5;
    (**(local_148.super_Array<unsigned_char>.disposer)->_vptr_ArrayDisposer)
              (local_148.super_Array<unsigned_char>.disposer,puVar1,1,pcVar5,pcVar5,0);
    in_R8W = SUB82(pcVar10,0);
  }
  if ((bool)(bVar11 & _::Debug::minSeverity < 3)) {
    pcVar5 = "\"failed: expected \" \"encodeWwwForm(\\\"\\\\xab\\\\xba\\\") == \\\"%AB%BA\\\"\"";
    in_R8W.nulTerminate = true;
    in_R8W.plusToSpace = true;
    _::Debug::log<char_const(&)[55]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/encoding-test.c++"
               ,0x156,ERROR,
               "\"failed: expected \" \"encodeWwwForm(\\\"\\\\xab\\\\xba\\\") == \\\"%AB%BA\\\"\"",
               (char (*) [55])"failed: expected encodeWwwForm(\"\\xab\\xba\") == \"%AB%BA\"");
  }
  bytes_03.size_ = (size_t)pcVar5;
  bytes_03.ptr = (uchar *)0x7;
  encodeWwwForm((String *)&local_148,(kj *)"foo",bytes_03);
  puVar1 = local_148.super_Array<unsigned_char>.ptr;
  pcVar5 = (char *)local_148.super_Array<unsigned_char>.size_;
  bVar11 = true;
  if ((char *)local_148.super_Array<unsigned_char>.size_ == (char *)0xa) {
    bVar11 = (char)*(long *)((long)local_148.super_Array<unsigned_char>.ptr + 8) != 'r' ||
             *(long *)local_148.super_Array<unsigned_char>.ptr != 0x61623030256f6f66;
  }
  if ((long *)local_148.super_Array<unsigned_char>.ptr != (long *)0x0) {
    local_148.super_Array<unsigned_char>.ptr = (uchar *)0x0;
    local_148.super_Array<unsigned_char>.size_ = 0;
    pcVar10 = pcVar5;
    (**(local_148.super_Array<unsigned_char>.disposer)->_vptr_ArrayDisposer)
              (local_148.super_Array<unsigned_char>.disposer,puVar1,1,pcVar5,pcVar5,0);
    in_R8W = SUB82(pcVar10,0);
  }
  if ((bool)(bVar11 & _::Debug::minSeverity < 3)) {
    pcVar5 = 
    "\"failed: expected \" \"encodeWwwForm(StringPtr(\\\"foo\\\\0bar\\\", 7)) == \\\"foo%00bar\\\"\""
    ;
    in_R8W.nulTerminate = true;
    in_R8W.plusToSpace = true;
    _::Debug::log<char_const(&)[72]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/encoding-test.c++"
               ,0x157,ERROR,
               "\"failed: expected \" \"encodeWwwForm(StringPtr(\\\"foo\\\\0bar\\\", 7)) == \\\"foo%00bar\\\"\""
               ,(char (*) [72])
                "failed: expected encodeWwwForm(StringPtr(\"foo\\0bar\", 7)) == \"foo%00bar\"");
  }
  bytes_04.size_ = (size_t)pcVar5;
  bytes_04.ptr = &DAT_0000000a;
  encodeWwwForm((String *)&local_148,(kj *)"\'foo\'! (~)",bytes_04);
  puVar1 = local_148.super_Array<unsigned_char>.ptr;
  sVar8 = local_148.super_Array<unsigned_char>.size_;
  bVar11 = true;
  if (local_148.super_Array<unsigned_char>.size_ == 0x17) {
    auVar13[0] = -(local_148.super_Array<unsigned_char>.ptr[6] == '%');
    auVar13[1] = -(local_148.super_Array<unsigned_char>.ptr[7] == '2');
    auVar13[2] = -(local_148.super_Array<unsigned_char>.ptr[8] == '7');
    auVar13[3] = -(local_148.super_Array<unsigned_char>.ptr[9] == '%');
    auVar13[4] = -(local_148.super_Array<unsigned_char>.ptr[10] == '2');
    auVar13[5] = -(local_148.super_Array<unsigned_char>.ptr[0xb] == '1');
    auVar13[6] = -(local_148.super_Array<unsigned_char>.ptr[0xc] == '+');
    auVar13[7] = -(local_148.super_Array<unsigned_char>.ptr[0xd] == '%');
    auVar13[8] = -(local_148.super_Array<unsigned_char>.ptr[0xe] == '2');
    auVar13[9] = -(local_148.super_Array<unsigned_char>.ptr[0xf] == '8');
    auVar13[10] = -(local_148.super_Array<unsigned_char>.ptr[0x10] == '%');
    auVar13[0xb] = -(local_148.super_Array<unsigned_char>.ptr[0x11] == '7');
    auVar13[0xc] = -(local_148.super_Array<unsigned_char>.ptr[0x12] == 'E');
    auVar13[0xd] = -(local_148.super_Array<unsigned_char>.ptr[0x13] == '%');
    auVar13[0xe] = -(local_148.super_Array<unsigned_char>.ptr[0x14] == '2');
    auVar13[0xf] = -(local_148.super_Array<unsigned_char>.ptr[0x15] == '9');
    auVar12[0] = -(*local_148.super_Array<unsigned_char>.ptr == '%');
    auVar12[1] = -(local_148.super_Array<unsigned_char>.ptr[1] == '2');
    auVar12[2] = -(local_148.super_Array<unsigned_char>.ptr[2] == '7');
    auVar12[3] = -(local_148.super_Array<unsigned_char>.ptr[3] == 'f');
    auVar12[4] = -(local_148.super_Array<unsigned_char>.ptr[4] == 'o');
    auVar12[5] = -(local_148.super_Array<unsigned_char>.ptr[5] == 'o');
    auVar12[6] = -(local_148.super_Array<unsigned_char>.ptr[6] == '%');
    auVar12[7] = -(local_148.super_Array<unsigned_char>.ptr[7] == '2');
    auVar12[8] = -(local_148.super_Array<unsigned_char>.ptr[8] == '7');
    auVar12[9] = -(local_148.super_Array<unsigned_char>.ptr[9] == '%');
    auVar12[10] = -(local_148.super_Array<unsigned_char>.ptr[10] == '2');
    auVar12[0xb] = -(local_148.super_Array<unsigned_char>.ptr[0xb] == '1');
    auVar12[0xc] = -(local_148.super_Array<unsigned_char>.ptr[0xc] == '+');
    auVar12[0xd] = -(local_148.super_Array<unsigned_char>.ptr[0xd] == '%');
    auVar12[0xe] = -(local_148.super_Array<unsigned_char>.ptr[0xe] == '2');
    auVar12[0xf] = -(local_148.super_Array<unsigned_char>.ptr[0xf] == '8');
    auVar12 = auVar12 & auVar13;
    bVar11 = (ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe |
                     (ushort)(byte)(auVar12[0xf] >> 7) << 0xf) != 0xffff;
  }
  if (local_148.super_Array<unsigned_char>.ptr != (uchar *)0x0) {
    local_148.super_Array<unsigned_char>.ptr = (uchar *)0x0;
    local_148.super_Array<unsigned_char>.size_ = 0;
    (**(local_148.super_Array<unsigned_char>.disposer)->_vptr_ArrayDisposer)
              (local_148.super_Array<unsigned_char>.disposer,puVar1,1,sVar8,sVar8,0);
    in_R8W = SUB82(sVar8,0);
  }
  if ((bool)(bVar11 & _::Debug::minSeverity < 3)) {
    in_R8W.nulTerminate = true;
    in_R8W.plusToSpace = true;
    _::Debug::log<char_const(&)[73]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/encoding-test.c++"
               ,0x15a,ERROR,
               "\"failed: expected \" \"encodeWwwForm(\\\"\'foo\'! (~)\\\") == \\\"%27foo%27%21+%28%7E%29\\\"\""
               ,(char (*) [73])
                "failed: expected encodeWwwForm(\"\'foo\'! (~)\") == \"%27foo%27%21+%28%7E%29\"");
  }
  text.size_ = 0x101;
  text.ptr = &DAT_00000009;
  decodeBinaryUriComponent(&local_148,(kj *)"foo%20bar",text,in_R8W);
  local_38.super_String.content.ptr = (char *)local_148.super_Array<unsigned_char>.ptr;
  local_38.super_String.content.size_ = local_148.super_Array<unsigned_char>.size_;
  local_38.super_String.content.disposer = local_148.super_Array<unsigned_char>.disposer;
  local_38.hadErrors = local_148.hadErrors;
  (anonymous_namespace)::expectRes<kj::String,char,8ul>(&local_38,(char (*) [8])0x388b39,false);
  sVar8 = local_38.super_String.content.size_;
  pcVar5 = local_38.super_String.content.ptr;
  if ((uchar *)local_38.super_String.content.ptr != (uchar *)0x0) {
    local_38.super_String.content.ptr = (char *)0x0;
    local_38.super_String.content.size_ = 0;
    (**(local_38.super_String.content.disposer)->_vptr_ArrayDisposer)
              (local_38.super_String.content.disposer,pcVar5,1,sVar8,sVar8,0);
    in_R8W = SUB82(sVar8,0);
  }
  text_00.size_ = 0x101;
  text_00.ptr = (char *)0x7;
  decodeBinaryUriComponent(&local_148,(kj *)"foo+bar",text_00,in_R8W);
  local_58.super_String.content.ptr = (char *)local_148.super_Array<unsigned_char>.ptr;
  local_58.super_String.content.size_ = local_148.super_Array<unsigned_char>.size_;
  local_58.super_String.content.disposer = local_148.super_Array<unsigned_char>.disposer;
  local_58.hadErrors = local_148.hadErrors;
  (anonymous_namespace)::expectRes<kj::String,char,8ul>(&local_58,(char (*) [8])0x388b39,false);
  sVar8 = local_58.super_String.content.size_;
  pcVar5 = local_58.super_String.content.ptr;
  if ((uchar *)local_58.super_String.content.ptr != (uchar *)0x0) {
    local_58.super_String.content.ptr = (char *)0x0;
    local_58.super_String.content.size_ = 0;
    (**(local_58.super_String.content.disposer)->_vptr_ArrayDisposer)
              (local_58.super_String.content.disposer,pcVar5,1,sVar8,sVar8,0);
    in_R8W = SUB82(sVar8,0);
  }
  pcVar5 = "%ab%BA";
  text_01.size_ = 0x101;
  text_01.ptr = (char *)0x6;
  decodeBinaryUriComponent(&local_148,(kj *)"%ab%BA",text_01,in_R8W);
  local_78.super_String.content.ptr = (char *)local_148.super_Array<unsigned_char>.ptr;
  local_78.super_String.content.size_ = local_148.super_Array<unsigned_char>.size_;
  local_78.super_String.content.disposer = local_148.super_Array<unsigned_char>.disposer;
  local_78.hadErrors = local_148.hadErrors;
  (anonymous_namespace)::expectRes<kj::String,char,3ul>(&local_78,(char (*) [3])pcVar5,errors);
  sVar8 = local_78.super_String.content.size_;
  pcVar5 = local_78.super_String.content.ptr;
  if ((uchar *)local_78.super_String.content.ptr != (uchar *)0x0) {
    local_78.super_String.content.ptr = (char *)0x0;
    local_78.super_String.content.size_ = 0;
    (**(local_78.super_String.content.disposer)->_vptr_ArrayDisposer)
              (local_78.super_String.content.disposer,pcVar5,1,sVar8,sVar8,0);
    in_R8W = SUB82(sVar8,0);
  }
  text_02.size_ = 0x101;
  text_02.ptr = &DAT_00000008;
  decodeBinaryUriComponent(&local_148,(kj *)"foo%1xxx",text_02,in_R8W);
  local_98.super_String.content.ptr = (char *)local_148.super_Array<unsigned_char>.ptr;
  local_98.super_String.content.size_ = local_148.super_Array<unsigned_char>.size_;
  local_98.super_String.content.disposer = local_148.super_Array<unsigned_char>.disposer;
  local_98.hadErrors = local_148.hadErrors;
  (anonymous_namespace)::expectRes<kj::String,char,8ul>(&local_98,(char (*) [8])"foo\x01xxx",true);
  sVar8 = local_98.super_String.content.size_;
  pcVar5 = local_98.super_String.content.ptr;
  if ((uchar *)local_98.super_String.content.ptr != (uchar *)0x0) {
    local_98.super_String.content.ptr = (char *)0x0;
    local_98.super_String.content.size_ = 0;
    (**(local_98.super_String.content.disposer)->_vptr_ArrayDisposer)
              (local_98.super_String.content.disposer,pcVar5,1,sVar8,sVar8,0);
    in_R8W = SUB82(sVar8,0);
  }
  text_03.size_ = 0x101;
  text_03.ptr = (char *)0x5;
  decodeBinaryUriComponent(&local_148,(kj *)"foo%1",text_03,in_R8W);
  local_b8.super_String.content.ptr = (char *)local_148.super_Array<unsigned_char>.ptr;
  local_b8.super_String.content.size_ = local_148.super_Array<unsigned_char>.size_;
  local_b8.super_String.content.disposer = local_148.super_Array<unsigned_char>.disposer;
  local_b8.hadErrors = local_148.hadErrors;
  (anonymous_namespace)::expectRes<kj::String,char,5ul>(&local_b8,(char (*) [5])"foo\x01",true);
  sVar8 = local_b8.super_String.content.size_;
  pcVar5 = local_b8.super_String.content.ptr;
  if ((uchar *)local_b8.super_String.content.ptr != (uchar *)0x0) {
    local_b8.super_String.content.ptr = (char *)0x0;
    local_b8.super_String.content.size_ = 0;
    (**(local_b8.super_String.content.disposer)->_vptr_ArrayDisposer)
              (local_b8.super_String.content.disposer,pcVar5,1,sVar8,sVar8,0);
    in_R8W = SUB82(sVar8,0);
  }
  text_04.size_ = 0x101;
  text_04.ptr = (char *)0x7;
  decodeBinaryUriComponent(&local_148,(kj *)"foo%xxx",text_04,in_R8W);
  local_d8.super_String.content.ptr = (char *)local_148.super_Array<unsigned_char>.ptr;
  local_d8.super_String.content.size_ = local_148.super_Array<unsigned_char>.size_;
  local_d8.super_String.content.disposer = local_148.super_Array<unsigned_char>.disposer;
  local_d8.hadErrors = local_148.hadErrors;
  (anonymous_namespace)::expectRes<kj::String,char,7ul>(&local_d8,(char (*) [7])"fooxxx",errors_00);
  sVar8 = local_d8.super_String.content.size_;
  pcVar5 = local_d8.super_String.content.ptr;
  if ((uchar *)local_d8.super_String.content.ptr != (uchar *)0x0) {
    local_d8.super_String.content.ptr = (char *)0x0;
    local_d8.super_String.content.size_ = 0;
    (**(local_d8.super_String.content.disposer)->_vptr_ArrayDisposer)
              (local_d8.super_String.content.disposer,pcVar5,1,sVar8,sVar8,0);
    in_R8W = SUB82(sVar8,0);
  }
  text_05.size_ = 0x101;
  text_05.ptr = (char *)0x4;
  uVar6 = 0x101;
  decodeBinaryUriComponent(&local_148,(kj *)"foo%",text_05,in_R8W);
  sVar7 = CONCAT71((int7)((ulong)uVar6 >> 8),local_148.hadErrors);
  local_f8.super_String.content.ptr = (char *)local_148.super_Array<unsigned_char>.ptr;
  local_f8.super_String.content.size_ = local_148.super_Array<unsigned_char>.size_;
  local_f8.super_String.content.disposer = local_148.super_Array<unsigned_char>.disposer;
  local_f8.hadErrors = local_148.hadErrors;
  (anonymous_namespace)::expectRes<kj::String,char,4ul>(&local_f8,(char (*) [4])0x1,errors_01);
  sVar8 = local_f8.super_String.content.size_;
  pcVar5 = local_f8.super_String.content.ptr;
  if ((uchar *)local_f8.super_String.content.ptr != (uchar *)0x0) {
    local_f8.super_String.content.ptr = (char *)0x0;
    local_f8.super_String.content.size_ = 0;
    sVar7 = sVar8;
    (**(local_f8.super_String.content.disposer)->_vptr_ArrayDisposer)
              (local_f8.super_String.content.disposer,pcVar5,1,sVar8,sVar8,0);
    in_R8W = SUB82(sVar7,0);
    sVar7 = sVar8;
  }
  local_11a = 0x38;
  local_11c = 0x220c;
  bytes_05.size_ = sVar7;
  bytes_05.ptr = (uchar *)0x3;
  encodeWwwForm((String *)local_118,(kj *)&local_11c,bytes_05);
  this_00 = (kj *)local_118._8_8_;
  if ((kj *)local_118._8_8_ != (kj *)0x0) {
    this_00 = (kj *)local_118._0_8_;
  }
  pkVar9 = (kj *)0x0;
  if ((kj *)local_118._8_8_ != (kj *)0x0) {
    pkVar9 = (kj *)(local_118._8_8_ + -1);
  }
  text_06.size_ = 0x100;
  text_06.ptr = (char *)pkVar9;
  decodeBinaryUriComponent(&local_148,this_00,text_06,in_R8W);
  puVar1 = local_148.super_Array<unsigned_char>.ptr;
  sVar8 = local_148.super_Array<unsigned_char>.size_;
  if (local_148.super_Array<unsigned_char>.size_ == 3) {
    lVar4 = 0;
    do {
      if (local_148.super_Array<unsigned_char>.ptr[lVar4] != *(uchar *)((long)&local_11c + lVar4)) {
        bVar3 = false;
        break;
      }
      lVar4 = lVar4 + 1;
      bVar3 = local_148.super_Array<unsigned_char>.size_ == 3;
    } while (lVar4 != 3);
  }
  else {
    bVar11 = false;
    bVar3 = false;
    if (local_148.super_Array<unsigned_char>.ptr == (uchar *)0x0) goto LAB_00223aa0;
  }
  bVar11 = bVar3;
  local_148.super_Array<unsigned_char>.ptr = (uchar *)0x0;
  local_148.super_Array<unsigned_char>.size_ = 0;
  (**(local_148.super_Array<unsigned_char>.disposer)->_vptr_ArrayDisposer)
            (local_148.super_Array<unsigned_char>.disposer,puVar1,1,sVar8,sVar8,0);
LAB_00223aa0:
  uVar6 = local_118._0_8_;
  if ((char *)local_118._0_8_ != (char *)0x0) {
    uVar2 = local_118._8_8_;
    local_118 = (undefined1  [16])0x0;
    (**local_108->_vptr_ArrayDisposer)(local_108,uVar6,1,uVar2,uVar2,0);
  }
  if (!(bool)(bVar11 | 2 < _::Debug::minSeverity)) {
    _::Debug::log<char_const(&)[82]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/encoding-test.c++"
               ,0x168,ERROR,
               "\"failed: expected \" \"decodeBinaryUriComponent(encodeWwwForm(bytes), options) == bytes\""
               ,(char (*) [82])
                "failed: expected decodeBinaryUriComponent(encodeWwwForm(bytes), options) == bytes")
    ;
  }
  return;
}

Assistant:

TEST(Async, SeparateFulfillerCanceled) {
  auto pair = newPromiseAndFulfiller<void>();

  EXPECT_TRUE(pair.fulfiller->isWaiting());
  pair.promise = nullptr;
  EXPECT_FALSE(pair.fulfiller->isWaiting());
}